

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_build_mamba::build_mamba_layer
          (llm_build_mamba *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *state_copy,
          ggml_tensor *state_mask,llama_ubatch *ubatch,int il)

{
  undefined4 uVar1;
  byte bVar2;
  uint uVar3;
  value_type pgVar4;
  int64_t iVar5;
  int64_t iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  const_reference ppgVar10;
  ggml_tensor *pgVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  undefined8 uVar18;
  const_reference pvVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  byte *in_R9;
  int in_stack_00000008;
  ggml_tensor *y;
  ggml_tensor *y_ssm;
  ggml_tensor *C;
  ggml_tensor *B;
  ggml_tensor *dt;
  ggml_tensor *x_db;
  ggml_tensor *last_conv;
  ggml_tensor *conv_x;
  ggml_tensor *z;
  ggml_tensor *x;
  ggml_tensor *xz;
  ggml_tensor *ssm;
  ggml_tensor *conv;
  ggml_tensor *ssm_states_all;
  ggml_tensor *conv_states_all;
  int64_t n_seq_tokens;
  float norm_rms_eps;
  bool ssm_dt_b_c_rms;
  int64_t n_seqs;
  int64_t dt_rank;
  int64_t d_state;
  int64_t d_inner;
  int64_t d_conv;
  uint32_t kv_head;
  llama_kv_cache_unified *kv_self;
  ggml_tensor *in_stack_fffffffffffffd50;
  value_type cur_00;
  ggml_tensor *in_stack_fffffffffffffd58;
  llm_graph_context *in_stack_fffffffffffffd60;
  llm_graph_context *this_00;
  undefined8 in_stack_fffffffffffffd68;
  int32_t n_state;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_cgraph *in_stack_fffffffffffffd88;
  llm_graph_context *in_stack_fffffffffffffd90;
  int32_t in_stack_fffffffffffffda0;
  undefined8 local_e0;
  undefined8 local_d8;
  
  n_state = (int32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  lVar15 = *(long *)(in_RDI + 0xe8);
  uVar3 = *(uint *)(lVar15 + 0x68);
  uVar20 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x18d8);
  uVar21 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x18dc);
  uVar22 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x18e0);
  uVar23 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x18e4);
  uVar24 = (ulong)*(uint *)(in_R9 + 0xc);
  bVar2 = *(byte *)(*(long *)(in_RDI + 8) + 0x18e8);
  uVar1 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1878);
  uVar9 = (ulong)*(uint *)(in_R9 + 8);
  if (uVar24 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x21e7,"GGML_ASSERT(%s) failed","n_seqs != 0");
  }
  if ((*in_R9 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x21e8,"GGML_ASSERT(%s) failed","ubatch.equal_seqs");
  }
  if ((ulong)*(uint *)(in_R9 + 4) != uVar9 * uVar24) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x21e9,"GGML_ASSERT(%s) failed","ubatch.n_tokens == n_seq_tokens * n_seqs");
  }
  ppgVar10 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar15 + 0x90),
                        (long)in_stack_00000008);
  pgVar4 = *ppgVar10;
  ppgVar10 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar15 + 0xa8),
                        (long)in_stack_00000008);
  cur_00 = *ppgVar10;
  llama_hparams::n_embd_k_s(*(llama_hparams **)(in_RDI + 8));
  pgVar11 = llm_graph_context::build_copy_mask_state
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,n_state,
                       in_stack_fffffffffffffda0);
  uVar12 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar20 - 1,uVar21,uVar24);
  llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  pgVar11 = llm_graph_context::build_copy_mask_state
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,n_state,
                       in_stack_fffffffffffffda0);
  uVar13 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar22,uVar21,uVar24);
  ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),in_RDX,*(undefined8 *)(in_RDX + 0x10),uVar9,uVar24)
  ;
  std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
            ((vector<llama_layer,_std::allocator<llama_layer>_> *)
             (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  pgVar11 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
                      );
  uVar14 = ggml_view_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar21,pgVar11->ne[1],pgVar11->ne[2],
                        pgVar11->nb[1],pgVar11->nb[2],0);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  iVar5 = pgVar11->ne[1];
  iVar6 = pgVar11->ne[2];
  sVar7 = pgVar11->nb[1];
  sVar8 = pgVar11->nb[2];
  lVar15 = ggml_element_size(pgVar11);
  uVar16 = ggml_view_3d(uVar18,pgVar11,uVar21,iVar5,iVar6,sVar7,sVar8,uVar21 * lVar15);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_transpose(*(undefined8 *)(in_RDI + 0xc0),uVar14);
  lVar15 = ggml_concat(uVar18,uVar12,uVar14,0);
  uVar14 = ggml_view_3d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar20 - 1,uVar21,uVar24,
                        *(undefined8 *)(lVar15 + 0x38),*(undefined8 *)(lVar15 + 0x40),
                        uVar9 * *(long *)(lVar15 + 0x30));
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  lVar17 = ggml_element_size(pgVar4);
  uVar12 = ggml_view_1d(uVar12,pgVar4,(uVar20 - 1) * uVar21 * uVar24,
                        (ulong)uVar3 * (uVar20 - 1) * uVar21 * lVar17);
  uVar18 = ggml_cpy(uVar18,uVar14,uVar12);
  ggml_build_forward_expand(in_RSI,uVar18);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  pvVar19 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  uVar12 = ggml_ssm_conv(uVar18,lVar15,pvVar19->ssm_conv1d);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  pvVar19 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  uVar18 = ggml_add(uVar18,uVar12,pvVar19->ssm_conv1d_b);
  lVar15 = ggml_silu(*(undefined8 *)(in_RDI + 0xc0),uVar18);
  std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
            ((vector<llama_layer,_std::allocator<llama_layer>_> *)
             (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  pgVar11 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
                      );
  uVar12 = ggml_view_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar23,uVar9,uVar24,pgVar11->nb[1],
                        pgVar11->nb[2],0);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  sVar7 = pgVar11->nb[1];
  sVar8 = pgVar11->nb[2];
  lVar17 = ggml_element_size(pgVar11);
  local_d8 = ggml_view_3d(uVar18,pgVar11,uVar22,uVar9,uVar24,sVar7,sVar8,lVar17 * uVar23);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  sVar7 = pgVar11->nb[1];
  sVar8 = pgVar11->nb[2];
  lVar17 = ggml_element_size(pgVar11);
  local_e0 = ggml_view_3d(uVar18,pgVar11,uVar22,uVar9,uVar24,sVar7,sVar8,lVar17 * (uVar23 + uVar22))
  ;
  if ((bVar2 & 1) != 0) {
    ggml_rms_norm(uVar1,*(undefined8 *)(in_RDI + 0xc0),uVar12);
    local_d8 = ggml_rms_norm(uVar1,*(undefined8 *)(in_RDI + 0xc0),local_d8);
    local_e0 = ggml_rms_norm(uVar1,*(undefined8 *)(in_RDI + 0xc0),local_e0);
  }
  std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
            ((vector<llama_layer,_std::allocator<llama_layer>_> *)
             (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  pgVar11 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
                      );
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  pvVar19 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  uVar12 = ggml_add(uVar18,pgVar11,pvVar19->ssm_dt_b);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  pvVar19 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  uVar12 = ggml_ssm_scan(uVar18,uVar13,lVar15,uVar12,pvVar19->ssm_a,local_d8,local_e0);
  this_00 = *(llm_graph_context **)(in_RDI + 0xc0);
  uVar13 = ggml_view_1d(*(undefined8 *)(in_RDI + 0xc0),uVar12,uVar22 * uVar21 * uVar24,
                        *(undefined8 *)(lVar15 + 0x48));
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  pgVar11 = (ggml_tensor *)(uVar22 * uVar21 * uVar24);
  lVar17 = ggml_element_size(cur_00);
  uVar18 = ggml_view_1d(uVar18,cur_00,pgVar11,uVar3 * uVar22 * uVar21 * lVar17);
  uVar18 = ggml_cpy(this_00,uVar13,uVar18);
  ggml_build_forward_expand(in_RSI,uVar18);
  uVar13 = ggml_view_3d(*(undefined8 *)(in_RDI + 0xc0),uVar12,uVar21,uVar9,uVar24,
                        *(undefined8 *)(lVar15 + 0x38),*(undefined8 *)(lVar15 + 0x40),0);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  pvVar19 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  uVar12 = ggml_mul(uVar12,lVar15,pvVar19->ssm_d);
  uVar13 = ggml_add(uVar18,uVar13,uVar12);
  uVar18 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_cont(*(undefined8 *)(in_RDI + 0xc0),uVar16);
  uVar12 = ggml_silu(uVar12,uVar14);
  ggml_mul(uVar18,uVar13,uVar12);
  std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
            ((vector<llama_layer,_std::allocator<llama_layer>_> *)
             (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000008);
  pgVar11 = llm_graph_context::build_lora_mm(this_00,pgVar11,cur_00);
  pgVar11 = (ggml_tensor *)
            ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),pgVar11,pgVar11->ne[0],uVar9 * uVar24);
  return pgVar11;
}

Assistant:

ggml_tensor * build_mamba_layer(
             ggml_cgraph * gf,
             ggml_tensor * cur,
             ggml_tensor * state_copy,
             ggml_tensor * state_mask,
      const llama_ubatch & ubatch,
                     int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto kv_head = kv_self->head;

        const int64_t d_conv  = hparams.ssm_d_conv;
        const int64_t d_inner = hparams.ssm_d_inner;
        const int64_t d_state = hparams.ssm_d_state;
        const int64_t dt_rank = hparams.ssm_dt_rank;
        const int64_t n_seqs  = ubatch.n_seqs;
        // Some variants of Mamba arch (e.g. FalconMamba do apply layer norm on B and Dt layers)
        const bool ssm_dt_b_c_rms = hparams.ssm_dt_b_c_rms;
        // Use the same RMS norm as the final layer norm
        const float norm_rms_eps = hparams.f_norm_rms_eps;

        const int64_t n_seq_tokens = ubatch.n_seq_tokens;

        GGML_ASSERT(n_seqs != 0);
        GGML_ASSERT(ubatch.equal_seqs);
        GGML_ASSERT(ubatch.n_tokens == n_seq_tokens * n_seqs);

        ggml_tensor * conv_states_all = kv_self->k_l[il];
        ggml_tensor * ssm_states_all  = kv_self->v_l[il];

        // (ab)using the KV cache to store the states
        ggml_tensor * conv = build_copy_mask_state(
                gf, conv_states_all, state_copy, state_mask,
                hparams.n_embd_k_s(), n_seqs);
        conv = ggml_reshape_3d(ctx0, conv, d_conv - 1, d_inner, n_seqs);
        ggml_tensor * ssm = build_copy_mask_state(
                gf, ssm_states_all, state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);
        ssm = ggml_reshape_3d(ctx0, ssm, d_state, d_inner, n_seqs);

        // {n_embd, n_tokens} => {n_embd, n_seq_tokens, n_seqs}
        cur = ggml_reshape_3d(ctx0, cur, cur->ne[0], n_seq_tokens, n_seqs);

        // {n_embd, 2*d_inner} @ {n_embd, n_seq_tokens, n_seqs} => {2*d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * xz = build_lora_mm(model.layers[il].ssm_in, cur);
        // split the above in two
        // => {d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * x = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], 0);
        ggml_tensor * z = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], d_inner*ggml_element_size(xz));

        // conv
        {
            // => {d_conv - 1 + n_seq_tokens, d_inner, n_seqs}
            ggml_tensor * conv_x = ggml_concat(ctx0, conv, ggml_transpose(ctx0, x), 0);

            // copy last (d_conv - 1) columns back into the state cache
            ggml_tensor * last_conv = ggml_view_3d(ctx0, conv_x, d_conv - 1, d_inner, n_seqs, conv_x->nb[1], conv_x->nb[2], n_seq_tokens*(conv_x->nb[0]));

            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0, last_conv,
                    ggml_view_1d(ctx0, conv_states_all,
                        (d_conv - 1)*(d_inner)*(n_seqs),
                        kv_head*(d_conv - 1)*(d_inner)*ggml_element_size(conv_states_all))));

            // 1D convolution
            // The equivalent is to make a self-overlapping view of conv_x
            // over d_conv columns at each stride in the 3rd dimension,
            // then element-wise multiply that with the conv1d weight,
            // then sum the elements of each row,
            // (the last two steps are a dot product over rows (also doable with mul_mat))
            // then permute away the ne[0] dimension,
            // and then you're left with the resulting x tensor.
            // For simultaneous sequences, all sequences need to have the same length.
            x = ggml_ssm_conv(ctx0, conv_x, model.layers[il].ssm_conv1d);

            // bias
            x = ggml_add(ctx0, x, model.layers[il].ssm_conv1d_b);

            x = ggml_silu(ctx0, x);
        }

        // ssm
        {
            // {d_inner, dt_rank + 2*d_state} @ {d_inner, n_seq_tokens, n_seqs} => {dt_rank + 2*d_state, n_seq_tokens, n_seqs}
            ggml_tensor * x_db = build_lora_mm(model.layers[il].ssm_x, x);
            // split
            ggml_tensor * dt = ggml_view_3d(ctx0, x_db, dt_rank, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], 0);
            ggml_tensor * B  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*dt_rank);
            ggml_tensor * C  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*(dt_rank+d_state));

            // Some Mamba variants (e.g. FalconMamba) apply RMS norm in B, C & Dt layers
            if (ssm_dt_b_c_rms) {
                dt = ggml_rms_norm(ctx0, dt, norm_rms_eps);
                B = ggml_rms_norm(ctx0, B, norm_rms_eps);
                C = ggml_rms_norm(ctx0, C, norm_rms_eps);
            }

            // {dt_rank, d_inner} @ {dt_rank, n_seq_tokens, n_seqs} => {d_inner, n_seq_tokens, n_seqs}
            dt = build_lora_mm(model.layers[il].ssm_dt, dt);
            dt = ggml_add(ctx0, dt, model.layers[il].ssm_dt_b);

            // Custom operator to optimize the parallel associative scan
            // as described in the Annex D of the Mamba paper.
            // => {d_inner, n_seq_tokens, n_seqs} and {d_state, d_inner, n_seqs}
            ggml_tensor * y_ssm = ggml_ssm_scan(ctx0, ssm, x, dt, model.layers[il].ssm_a, B, C);

            // store last states
            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0,
                    ggml_view_1d(ctx0, y_ssm, d_state*d_inner*n_seqs, x->nb[3]),
                    ggml_view_1d(ctx0, ssm_states_all, d_state*d_inner*n_seqs, kv_head*d_state*d_inner*ggml_element_size(ssm_states_all))));

            ggml_tensor * y = ggml_view_3d(ctx0, y_ssm, d_inner, n_seq_tokens, n_seqs, x->nb[1], x->nb[2], 0);

            // TODO: skip computing output earlier for unused tokens

            // {d_inner, n_seq_tokens, n_seqs} * {d_inner} => {d_inner, n_seq_tokens, n_seqs}
            y = ggml_add(ctx0, y, ggml_mul(ctx0, x, model.layers[il].ssm_d));
            y = ggml_mul(ctx0, y, ggml_silu(ctx0, ggml_cont(ctx0, z)));

            // {d_inner, n_embd} @ {d_inner, n_seq_tokens, n_seqs} => {n_embd, n_seq_tokens, n_seqs}
            cur = build_lora_mm(model.layers[il].ssm_out, y);
        }

        // {n_embd, n_seq_tokens, n_seqs} => {n_embd, n_tokens}
        cur = ggml_reshape_2d(ctx0, cur, cur->ne[0], n_seq_tokens * n_seqs);
        //cb(cur, "mamba_out", il);

        return cur;
    }